

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http.c
# Opt level: O2

char * Curl_copy_header_value(char *header)

{
  byte *__s;
  char cVar1;
  int iVar2;
  byte *pbVar3;
  size_t sVar4;
  char *pcVar5;
  byte *pbVar6;
  byte *__n;
  long lVar7;
  
  for (lVar7 = 0; (cVar1 = header[lVar7], cVar1 != '\0' && (cVar1 != ':')); lVar7 = lVar7 + 1) {
  }
  pcVar5 = header + (cVar1 != '\0');
  while ((pcVar5[lVar7] != 0 && (iVar2 = Curl_isspace((uint)(byte)pcVar5[lVar7]), iVar2 != 0))) {
    lVar7 = lVar7 + 1;
  }
  __s = (byte *)(pcVar5 + lVar7);
  pbVar3 = (byte *)strchr((char *)__s,0xd);
  if ((pbVar3 == (byte *)0x0) && (pbVar3 = (byte *)strchr((char *)__s,10), pbVar3 == (byte *)0x0)) {
    sVar4 = strlen((char *)__s);
    pbVar3 = __s + sVar4;
  }
  pbVar6 = pbVar3 + (-lVar7 - (long)pcVar5) + 2;
  __n = pbVar3 + (-lVar7 - (long)pcVar5) + 1;
  while ((__s < pbVar3 && (iVar2 = Curl_isspace((uint)*pbVar3), iVar2 != 0))) {
    pbVar3 = pbVar3 + -1;
    pbVar6 = pbVar6 + -1;
    __n = __n + -1;
  }
  pcVar5 = (char *)(*Curl_cmalloc)((size_t)pbVar6);
  if (pcVar5 == (char *)0x0) {
    pcVar5 = (char *)0x0;
  }
  else {
    memcpy(pcVar5,__s,(size_t)__n);
    pcVar5[(long)__n] = '\0';
  }
  return pcVar5;
}

Assistant:

char *Curl_copy_header_value(const char *header)
{
  const char *start;
  const char *end;
  char *value;
  size_t len;

  /* Find the end of the header name */
  while(*header && (*header != ':'))
    ++header;

  if(*header)
    /* Skip over colon */
    ++header;

  /* Find the first non-space letter */
  start = header;
  while(*start && ISSPACE(*start))
    start++;

  /* data is in the host encoding so
     use '\r' and '\n' instead of 0x0d and 0x0a */
  end = strchr(start, '\r');
  if(!end)
    end = strchr(start, '\n');
  if(!end)
    end = strchr(start, '\0');
  if(!end)
    return NULL;

  /* skip all trailing space letters */
  while((end > start) && ISSPACE(*end))
    end--;

  /* get length of the type */
  len = end - start + 1;

  value = malloc(len + 1);
  if(!value)
    return NULL;

  memcpy(value, start, len);
  value[len] = 0; /* null-terminate */

  return value;
}